

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint ON_SubDEdgeChain::OrientEdgesIntoEdgeChains
               (ON_SimpleArray<const_ON_SubDEdge_*> *edges,
               ON_SimpleArray<ON_SubDEdgePtr> *edge_chains)

{
  ON_SubDEdge *edge;
  uint uVar1;
  ON_SubDEdge **ppOVar2;
  ON_SubDEdgePtr *this;
  ON_SubDEdgePtr OVar3;
  ON_SubDVertex *pOVar4;
  ON_SubDVertex *pOVar5;
  ON_SubDVertex *pOVar6;
  ON_SubDVertex *pOVar7;
  ON_SubDVertex *v [2];
  ON_SubDVertex *prev_v [2];
  ON_SubDEdgePtr *eptr;
  ON_SubDEdge *e;
  ON_SubDEdgePtr *pOStack_30;
  uint i;
  ON_SubDEdgePtr *prev_eptr;
  uint local_20;
  uint chain_length;
  uint chain_count;
  uint count;
  ON_SimpleArray<ON_SubDEdgePtr> *edge_chains_local;
  ON_SimpleArray<const_ON_SubDEdge_*> *edges_local;
  
  uVar1 = ON_SimpleArray<const_ON_SubDEdge_*>::UnsignedCount(edges);
  ON_SimpleArray<ON_SubDEdgePtr>::SetCount(edge_chains,0);
  ON_SimpleArray<ON_SubDEdgePtr>::Reserve(edge_chains,(ulong)uVar1);
  local_20 = 0;
  prev_eptr._4_4_ = 0;
  pOStack_30 = (ON_SubDEdgePtr *)0x0;
  for (e._4_4_ = 0; e._4_4_ < uVar1; e._4_4_ = e._4_4_ + 1) {
    ppOVar2 = ON_SimpleArray<const_ON_SubDEdge_*>::operator[](edges,e._4_4_);
    edge = *ppOVar2;
    if ((((edge != (ON_SubDEdge *)0x0) && (edge->m_vertex[0] != (ON_SubDVertex *)0x0)) &&
        (edge->m_vertex[1] != (ON_SubDVertex *)0x0)) && (edge->m_vertex[0] != edge->m_vertex[1])) {
      this = ON_SimpleArray<ON_SubDEdgePtr>::AppendNew(edge_chains);
      OVar3 = ON_SubDEdgePtr::Create(edge);
      this->m_ptr = OVar3.m_ptr;
      if (pOStack_30 != (ON_SubDEdgePtr *)0x0) {
        pOVar4 = ON_SubDEdgePtr::RelativeVertex(pOStack_30,1);
        pOVar5 = ON_SubDEdgePtr::RelativeVertex(this,0);
        if (pOVar4 != pOVar5) {
          pOVar4 = ON_SubDEdgePtr::RelativeVertex(pOStack_30,0);
          pOVar5 = ON_SubDEdgePtr::RelativeVertex(pOStack_30,1);
          pOVar6 = ON_SubDEdgePtr::RelativeVertex(this,0);
          pOVar7 = ON_SubDEdgePtr::RelativeVertex(this,1);
          if (pOVar5 == pOVar7) {
            OVar3 = ON_SubDEdgePtr::Reversed(this);
            this->m_ptr = OVar3.m_ptr;
          }
          else if (prev_eptr._4_4_ == 1) {
            if (pOVar4 == pOVar6) {
              OVar3 = ON_SubDEdgePtr::Reversed(pOStack_30);
              pOStack_30->m_ptr = OVar3.m_ptr;
            }
            else if (pOVar4 == pOVar7) {
              OVar3 = ON_SubDEdgePtr::Reversed(pOStack_30);
              pOStack_30->m_ptr = OVar3.m_ptr;
              OVar3 = ON_SubDEdgePtr::Reversed(this);
              this->m_ptr = OVar3.m_ptr;
            }
            else {
              pOStack_30 = (ON_SubDEdgePtr *)0x0;
            }
          }
          else {
            pOStack_30 = (ON_SubDEdgePtr *)0x0;
          }
        }
      }
      if (pOStack_30 == (ON_SubDEdgePtr *)0x0) {
        local_20 = 1;
        prev_eptr._4_4_ = 0;
      }
      prev_eptr._4_4_ = prev_eptr._4_4_ + 1;
      pOStack_30 = this;
    }
  }
  return local_20;
}

Assistant:

unsigned int ON_SubDEdgeChain::OrientEdgesIntoEdgeChains(
  const ON_SimpleArray< const ON_SubDEdge* >& edges,
  ON_SimpleArray< ON_SubDEdgePtr >& edge_chains
)
{
  const unsigned count = edges.UnsignedCount();
  edge_chains.SetCount(0);
  edge_chains.Reserve(count);
  unsigned int chain_count = 0;
  unsigned chain_length = 0;
  ON_SubDEdgePtr* prev_eptr = nullptr;
  for (unsigned i = 0; i < count; ++i)
  {
    const ON_SubDEdge* e = edges[i];
    if (nullptr == e || nullptr == e->m_vertex[0] || nullptr == e->m_vertex[1] || e->m_vertex[0] == e->m_vertex[1])
      continue;
    ON_SubDEdgePtr& eptr = edge_chains.AppendNew();
    eptr = ON_SubDEdgePtr::Create(e);
    if (nullptr != prev_eptr && prev_eptr->RelativeVertex(1) != eptr.RelativeVertex(0) )
    {
      const ON_SubDVertex* prev_v[2] = { prev_eptr->RelativeVertex(0), prev_eptr->RelativeVertex(1) };
      const ON_SubDVertex* v[2] = { eptr.RelativeVertex(0), eptr.RelativeVertex(1) };
      if (prev_v[1] == v[1])
        eptr = eptr.Reversed();
      else if (1 == chain_length)
      {
        if (prev_v[0] == v[0])
          *prev_eptr = prev_eptr->Reversed();
        else if (prev_v[0] == v[1])
        {
          *prev_eptr = prev_eptr->Reversed();
          eptr = eptr.Reversed();
        }
        else
          prev_eptr = nullptr;
      }
      else
        prev_eptr = nullptr;
    }

    if (nullptr == prev_eptr)
    {
      chain_count = 1;
      chain_length = 0;
    }
    prev_eptr = &eptr;
    ++chain_length;
  }
  return chain_count;
}